

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O1

void VTuneChakraProfile::LogMethodNativeLoadEvent
               (FunctionBody *body,FunctionEntryPointInfo *entryPoint)

{
  short sVar1;
  code *pcVar2;
  FunctionBody *body_00;
  ExecutionMode EVar3;
  bool bVar4;
  ULONG UVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char16 *pcVar9;
  long lVar10;
  size_t sVar11;
  undefined4 *puVar12;
  HeapAllocator *pHVar13;
  ptrdiff_t pVar14;
  TrackAllocData *obj;
  utf8char_t *buffer;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint cchSource;
  char16_t local_308 [4];
  char16 numberBuffer [20];
  char16_t local_2d8;
  undefined1 local_2d6 [6];
  char16 methodNameBuffer [260];
  undefined1 local_c8 [8];
  TrackAllocData data;
  size_t urlLength;
  utf8char_t *puStack_90;
  DWORD_PTR local_88;
  undefined8 uStack_80;
  TrackAllocData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  utf8char_t *puStack_60;
  ulong local_50;
  utf8char_t *local_48;
  FunctionBody *local_40;
  ULONG local_34;
  
  if (!isJitProfilingActive) {
    return;
  }
  local_68 = 0;
  puStack_60 = (utf8char_t *)0x0;
  local_78 = (TrackAllocData *)0x0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  urlLength = 0;
  puStack_90 = (utf8char_t *)0x0;
  pcVar9 = Js::ParseableFunctionInfo::GetExternalDisplayName(&body->super_ParseableFunctionInfo);
  UVar5 = Js::ParseableFunctionInfo::GetLineNumber(&body->super_ParseableFunctionInfo);
  _ltow((ulong)UVar5,local_308,10);
  if (pcVar9 == (char16 *)0x0) {
LAB_007d9dcf:
    local_2d8 = L'\0';
    memset(local_2d6,0xfd,0x206);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else {
    lVar10 = 0x104;
    lVar15 = 0;
    do {
      sVar1 = *(short *)((long)pcVar9 + lVar15);
      *(short *)(local_2d6 + lVar15 + -2) = sVar1;
      if (sVar1 == 0) goto LAB_007d9d9a;
      lVar15 = lVar15 + 2;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    lVar10 = 0;
LAB_007d9d9a:
    if (lVar10 == 0) goto LAB_007d9dcf;
    if (0x105U - lVar10 < 0x104) {
      memset(local_2d6 + (0x105U - lVar10) * 2 + -2,0xfd,lVar10 * 2 - 2);
    }
  }
  EVar3 = Js::FunctionEntryPointInfo::GetJitMode(entryPoint);
  if (EVar3 == SimpleJit) {
    lVar10 = -0x104;
    do {
      if (methodNameBuffer[lVar10 + 0x100] == L'\0') {
        lVar15 = -lVar10;
        lVar17 = 0;
        goto LAB_007d9e33;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
    goto LAB_007d9e92;
  }
  goto LAB_007d9ebe;
  while( true ) {
    lVar17 = lVar17 + 2;
    lVar15 = lVar15 + -1;
    if (lVar15 == 0) break;
LAB_007d9ee6:
    sVar1 = *(short *)((long)L" {line:" + lVar17);
    *(short *)((long)methodNameBuffer + lVar10 * 2 + lVar17 + 0x200) = sVar1;
    if (sVar1 == 0) goto LAB_007d9f10;
  }
  lVar15 = 0;
LAB_007d9f10:
  if (lVar15 == 0) goto LAB_007d9f45;
  if (0x105U - lVar15 < 0x104) {
    memset(local_2d6 + (0x105U - lVar15) * 2 + -2,0xfd,lVar15 * 2 - 2);
  }
  goto LAB_007d9f71;
  while( true ) {
    lVar17 = lVar17 + 2;
    lVar15 = lVar15 + -1;
    if (lVar15 == 0) break;
LAB_007d9f92:
    sVar1 = *(short *)((long)local_308 + lVar17);
    *(short *)((long)methodNameBuffer + lVar10 * 2 + lVar17 + 0x200) = sVar1;
    if (sVar1 == 0) goto LAB_007d9fbd;
  }
  lVar15 = 0;
LAB_007d9fbd:
  if (lVar15 == 0) goto LAB_007d9ff2;
  if (0x105U - lVar15 < 0x104) {
    memset(local_2d6 + (0x105U - lVar15) * 2 + -2,0xfd,lVar15 * 2 - 2);
  }
  goto LAB_007da01e;
  while( true ) {
    lVar17 = lVar17 + 2;
    lVar15 = lVar15 + -1;
    if (lVar15 == 0) break;
LAB_007da046:
    sVar1 = *(short *)((long)L"function() {\n    [native code]\n}" + lVar17 + 0x3e);
    *(short *)((long)methodNameBuffer + lVar10 * 2 + lVar17 + 0x200) = sVar1;
    if (sVar1 == 0) goto LAB_007da070;
  }
  lVar15 = 0;
LAB_007da070:
  if (lVar15 != 0) {
    if (0x105U - lVar15 < 0x104) {
      memset(local_2d6 + (0x105U - lVar15) * 2 + -2,0xfd,lVar15 * 2 - 2);
    }
    goto LAB_007da0d1;
  }
  goto LAB_007da0a5;
  while( true ) {
    lVar17 = lVar17 + 2;
    lVar15 = lVar15 + -1;
    if (lVar15 == 0) break;
LAB_007d9e33:
    sVar1 = *(short *)((long)L" Simple" + lVar17);
    *(short *)((long)methodNameBuffer + lVar10 * 2 + lVar17 + 0x200) = sVar1;
    if (sVar1 == 0) goto LAB_007d9e5d;
  }
  lVar15 = 0;
LAB_007d9e5d:
  if (lVar15 == 0) {
LAB_007d9e92:
    local_2d8 = L'\0';
    memset(local_2d6,0xfd,0x206);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else if (0x105U - lVar15 < 0x104) {
    memset(local_2d6 + (0x105U - lVar15) * 2 + -2,0xfd,lVar15 * 2 - 2);
  }
LAB_007d9ebe:
  lVar10 = -0x104;
  do {
    if (methodNameBuffer[lVar10 + 0x100] == L'\0') {
      lVar15 = -lVar10;
      lVar17 = 0;
      goto LAB_007d9ee6;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0);
LAB_007d9f45:
  local_2d8 = L'\0';
  memset(local_2d6,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_007d9f71:
  lVar10 = -0x104;
  do {
    if (methodNameBuffer[lVar10 + 0x100] == L'\0') {
      lVar15 = -lVar10;
      lVar17 = 0;
      goto LAB_007d9f92;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0);
LAB_007d9ff2:
  local_2d8 = L'\0';
  memset(local_2d6,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_007da01e:
  lVar10 = -0x104;
  do {
    if (methodNameBuffer[lVar10 + 0x100] == L'\0') {
      lVar15 = -lVar10;
      lVar17 = 0;
      goto LAB_007da046;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0);
LAB_007da0a5:
  local_2d8 = L'\0';
  memset(local_2d6,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_007da0d1:
  sVar11 = PAL_wcslen(&local_2d8);
  if (0x103 < sVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/VTuneChakraProfile.cpp"
                       ,0x42,"(methodLength < 260)","methodLength < _MAX_PATH");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar12 = 0;
  }
  cchSource = (uint)sVar11;
  local_40 = body;
  local_34 = UVar5;
  if (cchSource < 0x55555555) {
    uVar16 = (ulong)(cchSource * 3 + 1);
    local_c8 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_32bd3bf;
    data.filename._0_4_ = 0x45;
    data.plusSize = uVar16;
    pHVar13 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_c8);
    local_48 = (utf8char_t *)Memory::HeapAllocator::AllocT<true>(pHVar13,uVar16);
    if (local_48 != (utf8char_t *)0x0) {
      uVar6 = iJIT_GetNewMethodID();
      urlLength = CONCAT44(urlLength._4_4_,uVar6);
      local_50 = uVar16;
      utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                (local_48,uVar16,&local_2d8,cchSource);
      puStack_90 = local_48;
      local_88 = Js::EntryPointInfo::GetNativeAddress(&entryPoint->super_EntryPointInfo);
      pVar14 = Js::EntryPointInfo::GetCodeSize(&entryPoint->super_EntryPointInfo);
      uStack_80 = CONCAT44(uStack_80._4_4_,(int)pVar14);
      iVar7 = Js::EntryPointInfo::GetNativeOffsetMapCount(&entryPoint->super_EntryPointInfo);
      uVar16 = (ulong)(iVar7 * 2 + 1);
      local_c8 = (undefined1  [8])&_LineNumberInfo::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_32bd3bf;
      data.filename._0_4_ = 0x51;
      data.plusSize = uVar16;
      pHVar13 = Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_c8);
      obj = (TrackAllocData *)Memory::HeapAllocator::AllocT<true>(pHVar13,uVar16 * 8);
      body_00 = local_40;
      if ((obj == (TrackAllocData *)0x0) || (DAT_015ad2f3 == '\x01')) {
        local_c8 = (undefined1  [8])((ulong)local_34 << 0x20);
        uVar8 = 1;
        local_78 = (TrackAllocData *)local_c8;
      }
      else {
        uVar8 = Js::EntryPointInfo::PopulateLineInfo(&entryPoint->super_EntryPointInfo,obj,local_40)
        ;
        local_78 = obj;
      }
      uStack_80 = CONCAT44(uVar8,(undefined4)uStack_80);
      data.line = 0;
      data._36_4_ = 0;
      buffer = GetUrl(body_00,(size_t *)&data.line);
      puStack_60 = buffer;
      Output::Trace(ProfilerPhase,L"Method load event: %s\n",&local_2d8);
      iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED,&urlLength);
      Memory::DeleteArray<Memory::HeapAllocator,_LineNumberInfo>
                (&Memory::HeapAllocator::Instance,uVar16,(_LineNumberInfo *)obj);
      if (data._32_8_ != 0) {
        Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,data._32_8_);
      }
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,local_48,local_50);
    }
    return;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

void VTuneChakraProfile::LogMethodNativeLoadEvent(Js::FunctionBody* body, Js::FunctionEntryPointInfo* entryPoint)
{
#if ENABLE_NATIVE_CODEGEN
    if (isJitProfilingActive)
    {
        iJIT_Method_Load methodInfo;
        memset(&methodInfo, 0, sizeof(iJIT_Method_Load));
        const char16* methodName = body->GetExternalDisplayName();
        // Append function line number info to method name so that VTune can distinguish between polymorphic methods
        char16 methodNameBuffer[_MAX_PATH];
        ULONG lineNumber = body->GetLineNumber();
        char16 numberBuffer[20];
        _ltow_s(lineNumber, numberBuffer, 10);
        wcscpy_s(methodNameBuffer, methodName);
        if (entryPoint->GetJitMode() == ExecutionMode::SimpleJit)
        {
            wcscat_s(methodNameBuffer, _u(" Simple"));
        }
        wcscat_s(methodNameBuffer, _u(" {line:"));
        wcscat_s(methodNameBuffer, numberBuffer);
        wcscat_s(methodNameBuffer, _u("}"));

        size_t methodLength = wcslen(methodNameBuffer);
        Assert(methodLength < _MAX_PATH);
        charcount_t ccMethodLength = static_cast<charcount_t>(methodLength);
        size_t cbUtf8MethodName = UInt32Math::MulAdd<3, 1>(ccMethodLength);
        utf8char_t* utf8MethodName = HeapNewNoThrowArray(utf8char_t, cbUtf8MethodName);
        if (utf8MethodName)
        {
            methodInfo.method_id = iJIT_GetNewMethodID();
            utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8MethodName, cbUtf8MethodName, methodNameBuffer, ccMethodLength);
            methodInfo.method_name = (char*)utf8MethodName;
            methodInfo.method_load_address = (void*)entryPoint->GetNativeAddress();
            methodInfo.method_size = (uint)entryPoint->GetCodeSize();        // Size in memory - Must be exact

            LineNumberInfo numberInfo[1];

            uint lineCount = (entryPoint->GetNativeOffsetMapCount()) * 2 + 1; // may need to record both .begin and .end for all elements
            LineNumberInfo* pLineInfo = HeapNewNoThrowArray(LineNumberInfo, lineCount);

            if (pLineInfo == NULL || Js::Configuration::Global.flags.DisableVTuneSourceLineInfo)
            {
                // resort to original implementation, attribute all samples to first line
                numberInfo[0].LineNumber = lineNumber;
                numberInfo[0].Offset = 0;
                methodInfo.line_number_size = 1;
                methodInfo.line_number_table = numberInfo;
            }
            else
            {
                int size = entryPoint->PopulateLineInfo(pLineInfo, body);
                methodInfo.line_number_size = size;
                methodInfo.line_number_table = pLineInfo;
            }

            size_t urlLength = 0;
            utf8char_t* utf8Url = GetUrl(body, &urlLength);
            methodInfo.source_file_name = (char*)utf8Url;
            OUTPUT_TRACE(Js::ProfilerPhase, _u("Method load event: %s\n"), methodNameBuffer);
            iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED, &methodInfo);

            HeapDeleteArray(lineCount, pLineInfo);

            if (urlLength > 0)
            {
                HeapDeleteArray(urlLength, utf8Url);
            }

            HeapDeleteArray(cbUtf8MethodName, utf8MethodName);
        }
    }
#endif
}